

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O0

void __thiscall test_suite::detail::suite_list::sort(suite_list *this)

{
  suite_list *this_local;
  
  std::
  sort<test_suite::detail::suite_info*,test_suite::detail::suite_list::sort()::_lambda(test_suite::detail::suite_info_const&,test_suite::detail::suite_info_const&)_1_>
            (this->data_,this->data_ + this->count_);
  return;
}

Assistant:

void
  sort()
  {
    std::sort(
        data_,
        data_ + count_,
        []( detail::suite_info const& lhs,
            detail::suite_info const& rhs)
        {
          return std::lexicographical_compare(
              lhs.name, lhs.name + std::strlen(lhs.name),
              rhs.name, rhs.name + std::strlen(rhs.name));
        });
  }